

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

int Abc_NtkMiterSatCreateInt(sat_solver *pSat,Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pSat_00;
  int iVar1;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Int_t *vVars_00;
  Abc_Obj_t *pAVar2;
  int local_68;
  int RetValue;
  int fUseMuxes;
  int k;
  int i;
  Vec_Int_t *vVars;
  Vec_Ptr_t *vSuper;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  Abc_Obj_t *pNodeC;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  sat_solver *pSat_local;
  
  local_68 = 0;
  pNode = (Abc_Obj_t *)pNtk;
  pNtk_local = (Abc_Ntk_t *)pSat;
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0x1de,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
  }
  for (fUseMuxes = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)pNode), fUseMuxes < iVar1;
      fUseMuxes = fUseMuxes + 1) {
    pFanin = Abc_NtkCi((Abc_Ntk_t *)pNode,fUseMuxes);
    (pFanin->field_6).pTemp = (void *)0x0;
  }
  p = Vec_PtrAlloc(1000);
  p_00 = Vec_PtrAlloc(100);
  vVars_00 = Vec_IntAlloc(100);
  pFanin = Abc_AigConst1((Abc_Ntk_t *)pNode);
  *(uint *)&pFanin->field_0x14 = *(uint *)&pFanin->field_0x14 & 0xffffffef | 0x10;
  pFanin->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)p->nSize;
  Vec_PtrPush(p,pFanin);
  Abc_NtkClauseTriv((sat_solver *)pNtk_local,pFanin,vVars_00);
  Vec_PtrClear(p_00);
  for (fUseMuxes = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pNode), fUseMuxes < iVar1;
      fUseMuxes = fUseMuxes + 1) {
    pFanin = Abc_NtkCo((Abc_Ntk_t *)pNode,fUseMuxes);
    pNodeC = Abc_ObjFanin0(pFanin);
    if ((*(uint *)&pNodeC->field_0x14 >> 4 & 1) == 0) {
      *(uint *)&pNodeC->field_0x14 = *(uint *)&pNodeC->field_0x14 & 0xffffffef | 0x10;
      pNodeC->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)p->nSize;
      Vec_PtrPush(p,pNodeC);
    }
    pAVar2 = Abc_ObjChild0(pFanin);
    Vec_PtrPush(p_00,pAVar2);
  }
  iVar1 = Abc_NtkClauseTop((sat_solver *)pNtk_local,p_00,vVars_00);
  if (iVar1 != 0) {
    for (fUseMuxes = 0; iVar1 = Vec_PtrSize(p), fUseMuxes < iVar1; fUseMuxes = fUseMuxes + 1) {
      pFanin = (Abc_Obj_t *)Vec_PtrEntry(p,fUseMuxes);
      iVar1 = Abc_ObjIsComplement(pFanin);
      if (iVar1 != 0) {
        __assert_fail("!Abc_ObjIsComplement(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                      ,0x20f,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
      }
      iVar1 = Abc_AigNodeIsAnd(pFanin);
      if (iVar1 != 0) {
        iVar1 = Abc_NodeIsMuxType(pFanin);
        if (iVar1 == 0) {
          Abc_NtkCollectSupergate(pFanin,1,p_00);
          for (RetValue = 0; iVar1 = Vec_PtrSize(p_00), pSat_00 = pNtk_local, RetValue < iVar1;
              RetValue = RetValue + 1) {
            pNodeC = (Abc_Obj_t *)Vec_PtrEntry(p_00,RetValue);
            pNodeC = Abc_ObjRegular(pNodeC);
            if ((*(uint *)&pNodeC->field_0x14 >> 4 & 1) == 0) {
              *(uint *)&pNodeC->field_0x14 = *(uint *)&pNodeC->field_0x14 & 0xffffffef | 0x10;
              pNodeC->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)p->nSize;
              Vec_PtrPush(p,pNodeC);
            }
          }
          if (p_00->nSize == 0) {
            pAVar2 = Abc_ObjNot(pFanin);
            iVar1 = Abc_NtkClauseTriv((sat_solver *)pSat_00,pAVar2,vVars_00);
          }
          else {
            iVar1 = Abc_NtkClauseAnd((sat_solver *)pNtk_local,pFanin,p_00,vVars_00);
          }
        }
        else {
          nMuxes = nMuxes + 1;
          pNodeT = Abc_NodeRecognizeMux(pFanin,&pNodeE,(Abc_Obj_t **)&vNodes);
          Vec_PtrClear(p_00);
          Vec_PtrPush(p_00,pNodeT);
          Vec_PtrPush(p_00,pNodeE);
          Vec_PtrPush(p_00,vNodes);
          for (RetValue = 0; iVar1 = Vec_PtrSize(p_00), RetValue < iVar1; RetValue = RetValue + 1) {
            pNodeC = (Abc_Obj_t *)Vec_PtrEntry(p_00,RetValue);
            pNodeC = Abc_ObjRegular(pNodeC);
            if ((*(uint *)&pNodeC->field_0x14 >> 4 & 1) == 0) {
              *(uint *)&pNodeC->field_0x14 = *(uint *)&pNodeC->field_0x14 & 0xffffffef | 0x10;
              pNodeC->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)p->nSize;
              Vec_PtrPush(p,pNodeC);
            }
          }
          iVar1 = Abc_NtkClauseMux((sat_solver *)pNtk_local,pFanin,pNodeT,pNodeE,(Abc_Obj_t *)vNodes
                                   ,vVars_00);
        }
        if (iVar1 == 0) goto LAB_0036dd09;
      }
    }
    local_68 = 1;
  }
LAB_0036dd09:
  Vec_IntFree(vVars_00);
  Vec_PtrFree(p);
  Vec_PtrFree(p_00);
  return local_68;
}

Assistant:

int Abc_NtkMiterSatCreateInt( sat_solver * pSat, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin, * pNodeC, * pNodeT, * pNodeE;
    Vec_Ptr_t * vNodes, * vSuper;
    Vec_Int_t * vVars;
    int i, k, fUseMuxes = 1;
//    int fOrderCiVarsFirst = 0;
    int RetValue = 0;

    assert( Abc_NtkIsStrash(pNtk) );

    // clean the CI node pointers
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;

    // start the data structures
    vNodes  = Vec_PtrAlloc( 1000 );   // the nodes corresponding to vars in the sat_solver
    vSuper  = Vec_PtrAlloc( 100 );    // the nodes belonging to the given implication supergate
    vVars   = Vec_IntAlloc( 100 );    // the temporary array for variables in the clause

    // add the clause for the constant node
    pNode = Abc_AigConst1(pNtk);
    pNode->fMarkA = 1;
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
    Vec_PtrPush( vNodes, pNode );
    Abc_NtkClauseTriv( pSat, pNode, vVars );
/*
    // add the PI variables first
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->fMarkA = 1;
        pNode->pCopy = (Abc_Obj_t *)vNodes->nSize;
        Vec_PtrPush( vNodes, pNode );
    }
*/
    // collect the nodes that need clauses and top-level assignments
    Vec_PtrClear( vSuper );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // get the fanin
        pFanin = Abc_ObjFanin0(pNode);
        // create the node's variable
        if ( pFanin->fMarkA == 0 )
        {
            pFanin->fMarkA = 1;
            pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
            Vec_PtrPush( vNodes, pFanin );
        }
        // add the trivial clause
        Vec_PtrPush( vSuper, Abc_ObjChild0(pNode) );
    }
    if ( !Abc_NtkClauseTop( pSat, vSuper, vVars ) )
        goto Quits;


    // add the clauses
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( !Abc_ObjIsComplement(pNode) );
        if ( !Abc_AigNodeIsAnd(pNode) )
            continue;
//printf( "%d ", pNode->Id );

        // add the clauses
        if ( fUseMuxes && Abc_NodeIsMuxType(pNode) )
        {
            nMuxes++;

            pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
            Vec_PtrClear( vSuper );
            Vec_PtrPush( vSuper, pNodeC );
            Vec_PtrPush( vSuper, pNodeT );
            Vec_PtrPush( vSuper, pNodeE );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( !Abc_NtkClauseMux( pSat, pNode, pNodeC, pNodeT, pNodeE, vVars ) )
                goto Quits;
        }
        else
        {
            // get the supergate
            Abc_NtkCollectSupergate( pNode, fUseMuxes, vSuper );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( vSuper->nSize == 0 )
            {
                if ( !Abc_NtkClauseTriv( pSat, Abc_ObjNot(pNode), vVars ) )
//                if ( !Abc_NtkClauseTriv( pSat, pNode, vVars ) )
                    goto Quits;
            }
            else
            {
                if ( !Abc_NtkClauseAnd( pSat, pNode, vSuper, vVars ) )
                    goto Quits;
            }
        }
    }
/*
    // set preferred variables
    if ( fOrderCiVarsFirst )
    {
        int * pPrefVars = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
        int nVars = 0;
        Abc_NtkForEachCi( pNtk, pNode, i )
        {
            if ( pNode->fMarkA == 0 )
                continue;
            pPrefVars[nVars++] = (int)pNode->pCopy;
        }
        nVars = Abc_MinInt( nVars, 10 );
        ASat_SolverSetPrefVars( pSat, pPrefVars, nVars );
    }
*/
/*
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        if ( !pNode->fMarkA )
            continue;
        printf( "%10s : ", Abc_ObjName(pNode) );
        printf( "%3d\n", (int)pNode->pCopy );
    }
    printf( "\n" );
*/
    RetValue = 1;
Quits :
    // delete
    Vec_IntFree( vVars );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vSuper );
    return RetValue;
}